

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

void arrays(void)

{
  rtosc_arg_val_t ra [16];
  rtosc_arg_val_t la [16];
  undefined8 in_stack_fffffffffffffce8;
  char type;
  int32_t len;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffcf4;
  undefined1 uVar2;
  undefined7 in_stack_fffffffffffffcf9;
  rtosc_cmp_options *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  undefined1 uVar3;
  undefined7 in_stack_fffffffffffffd11;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd1c;
  rtosc_arg_val_t *in_stack_fffffffffffffd20;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffd34;
  int in_stack_fffffffffffffd38;
  
  uVar2 = 0x61;
  type = (char)((ulong)in_stack_fffffffffffffce8 >> 0x38);
  rtosc_av_arr_type_set
            ((rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),type);
  rtosc_av_arr_type_set
            ((rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),type);
  len = (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  rtosc_av_arr_len_set
            ((rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),len);
  rtosc_av_arr_len_set
            ((rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),len);
  uVar3 = 0x69;
  uVar4 = 1;
  uVar5 = 2;
  uVar1 = 0xe2;
  cmp_gt(in_stack_fffffffffffffd20,(rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffd1c,1),
         CONCAT71(in_stack_fffffffffffffd11,0x69),in_stack_fffffffffffffd08,
         in_stack_fffffffffffffd00,(char *)CONCAT71(in_stack_fffffffffffffcf9,uVar2),
         (char *)CONCAT44(in_stack_fffffffffffffd34,2),in_stack_fffffffffffffd38);
  rtosc_av_arr_len_set((rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffcf4,uVar1),0);
  cmp_gt(in_stack_fffffffffffffd20,(rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffd1c,uVar4),
         CONCAT71(in_stack_fffffffffffffd11,uVar3),in_stack_fffffffffffffd08,
         in_stack_fffffffffffffd00,(char *)CONCAT71(in_stack_fffffffffffffcf9,uVar2),
         (char *)CONCAT44(in_stack_fffffffffffffd34,uVar5),in_stack_fffffffffffffd38);
  return;
}

Assistant:

void arrays()
{
    // fill three arrays, both with the ints 1, 2, 3 resp. 1, 2, 2
    rtosc_arg_val_t la[16], ra[16]; // left array, right array
    la[0].type = ra[0].type = 'a';
    rtosc_av_arr_type_set(la, 'i');
    rtosc_av_arr_type_set(ra, 'i');
    rtosc_av_arr_len_set(la, 3);
    rtosc_av_arr_len_set(ra, 3);
    la[1].type = la[2].type = la[3].type =
    ra[1].type = ra[2].type = ra[3].type = 'i';
    la[1].val.i = 1; la[2].val.i = 2; la[3].val.i = 3;
    ra[1].val.i = 1; ra[2].val.i = 2; ra[3].val.i = 2;

    // same size
    cmp_gt(la, ra, 4, 4, NULL, "[1 2 3]", "[1 2 2]", __LINE__);

    // different size
    rtosc_av_arr_len_set(ra, 2);
    ra[3].val.i = 3;
    cmp_gt(la, ra, 4, 4, NULL, "[1 2 3]", "[1 2] 3", __LINE__);
}